

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O2

void __thiscall S2Builder::Graph::VertexInMap::Init(VertexInMap *this,Graph *g)

{
  pointer ppVar1;
  long lVar2;
  VertexId v;
  int iVar3;
  EdgeId e;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  GetInEdgeIds((vector<int,_std::allocator<int>_> *)&local_40,g);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->in_edge_ids_,&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  std::vector<int,_std::allocator<int>_>::reserve(&this->in_edge_begins_,(long)g->num_vertices_ + 1)
  ;
  local_40._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  for (iVar3 = 0; iVar3 <= g->num_vertices_; iVar3 = iVar3 + 1) {
    ppVar1 = (g->edges_->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    lVar2 = (long)(int)local_40._M_impl.super__Vector_impl_data._M_start;
    while ((lVar2 < (int)((ulong)((long)(g->edges_->
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1)
                         >> 3) &&
           (ppVar1[(this->in_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar2]].second < iVar3))) {
      lVar2 = lVar2 + 1;
      local_40._M_impl.super__Vector_impl_data._M_start._0_4_ =
           (int)local_40._M_impl.super__Vector_impl_data._M_start + 1;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->in_edge_begins_,(value_type_conflict2 *)&local_40);
  }
  return;
}

Assistant:

void Graph::VertexInMap::Init(const Graph& g) {
  in_edge_ids_ = g.GetInEdgeIds();
  in_edge_begins_.reserve(g.num_vertices() + 1);
  EdgeId e = 0;
  for (VertexId v = 0; v <= g.num_vertices(); ++v) {
    while (e < g.num_edges() && g.edge(in_edge_ids_[e]).second < v) ++e;
    in_edge_begins_.push_back(e);
  }
}